

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O1

void __thiscall
tchecker::parsing::edge_declaration_t::edge_declaration_t
          (edge_declaration_t *this,
          shared_ptr<const_tchecker::parsing::process_declaration_t> *process,
          shared_ptr<const_tchecker::parsing::location_declaration_t> *src,
          shared_ptr<const_tchecker::parsing::location_declaration_t> *tgt,
          shared_ptr<const_tchecker::parsing::event_declaration_t> *event,attributes_t *attr,
          string *context)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  invalid_argument *this_00;
  
  declaration_t::declaration_t((declaration_t *)this,attr,context);
  (this->super_inner_declaration_t).super_declaration_t._vptr_declaration_t =
       (_func_int **)&PTR__edge_declaration_t_001255a0;
  (this->_process).
  super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (process->
           super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var1 = (process->
           super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->_process).
  super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->_src).
  super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (src->
           super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var1 = (src->
           super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->_src).
  super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->_tgt).
  super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (tgt->
           super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var1 = (tgt->
           super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->_tgt).
  super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->_event).
  super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (event->
           super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var1 = (event->
           super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->_event).
  super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  peVar2 = (this->_process).
           super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar3 = (((this->_src).
             super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_process).
           super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  sVar4 = (peVar3->_name)._M_string_length;
  sVar5 = (peVar2->_name)._M_string_length;
  if ((sVar4 == sVar5) &&
     ((sVar4 == 0 ||
      (iVar6 = bcmp((peVar3->_name)._M_dataplus._M_p,(peVar2->_name)._M_dataplus._M_p,sVar4),
      iVar6 == 0)))) {
    peVar3 = (((this->_tgt).
               super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_process).
             super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    sVar4 = (peVar3->_name)._M_string_length;
    if (sVar4 == sVar5) {
      if (sVar4 == 0) {
        return;
      }
      iVar6 = bcmp((peVar3->_name)._M_dataplus._M_p,(peVar2->_name)._M_dataplus._M_p,sVar4);
      if (iVar6 == 0) {
        return;
      }
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"error, edge declaration has target location does not belong to process");
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"error, edge declaration has source location that does not belong to process"
              );
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

edge_declaration_t::edge_declaration_t(std::shared_ptr<tchecker::parsing::process_declaration_t const> const & process,
                                       std::shared_ptr<tchecker::parsing::location_declaration_t const> const & src,
                                       std::shared_ptr<tchecker::parsing::location_declaration_t const> const & tgt,
                                       std::shared_ptr<tchecker::parsing::event_declaration_t const> const & event,
                                       tchecker::parsing::attributes_t const & attr, std::string const & context)
    : tchecker::parsing::inner_declaration_t(attr, context), _process(process), _src(src), _tgt(tgt), _event(event)
{
  if (_src->process().name() != _process->name())
    throw std::invalid_argument("error, edge declaration has source location that does not belong to process");

  if (_tgt->process().name() != _process->name())
    throw std::invalid_argument("error, edge declaration has target location does not belong to process");
}